

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

void libssh2_sftp_dtor(LIBSSH2_SESSION *session,void **session_abstract,LIBSSH2_CHANNEL *channel,
                      void **channel_abstract)

{
  void *pvVar1;
  
  pvVar1 = *channel_abstract;
  if (*(void **)((long)pvVar1 + 0x60) != (void *)0x0) {
    (*session->free)(*(void **)((long)pvVar1 + 0x60),&session->abstract);
  }
  if (*(void **)((long)pvVar1 + 200) != (void *)0x0) {
    (*session->free)(*(void **)((long)pvVar1 + 200),&session->abstract);
  }
  (*session->free)(pvVar1,&session->abstract);
  return;
}

Assistant:

LIBSSH2_CHANNEL_CLOSE_FUNC(libssh2_sftp_dtor)
{
    LIBSSH2_SFTP *sftp = (LIBSSH2_SFTP *) (*channel_abstract);

    (void)session_abstract;
    (void)channel;

    /* Free the partial packet storage for sftp_packet_read */
    if(sftp->partial_packet) {
        LIBSSH2_FREE(session, sftp->partial_packet);
    }

    /* Free the packet storage for _libssh2_sftp_packet_readdir */
    if(sftp->readdir_packet) {
        LIBSSH2_FREE(session, sftp->readdir_packet);
    }

    LIBSSH2_FREE(session, sftp);
}